

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall hypermind::Lexer::ParseNumber(Lexer *this)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  HMChar *pHVar4;
  int iVar5;
  HMUINT32 HVar6;
  char *__nptr;
  
  (this->mCurrentToken).type = Number;
  pHVar4 = this->mSource;
  uVar3 = this->mPosition;
  __nptr = pHVar4 + uVar3;
  (this->mCurrentToken).start = __nptr;
  (this->mCurrentToken).length = 0;
  (this->mCurrentToken).line = this->mLine;
  (this->mCurrentToken).value.type = Undefined;
  (this->mCurrentToken).value.field_1.intval = 0;
  HVar6 = 0;
  do {
    uVar1 = uVar3 + 1 + HVar6;
    this->mPosition = uVar1;
    cVar2 = pHVar4[uVar1];
    HVar6 = HVar6 + 1;
  } while (cVar2 == '.' || (byte)(cVar2 - 0x30U) < 10);
  (this->mCurrentToken).length = HVar6;
  (this->mCurrentToken).value.type = Integer;
  iVar5 = atoi(__nptr);
  (this->mCurrentToken).value.field_1.intval = iVar5;
  return;
}

Assistant:

void Lexer::ParseNumber() {
        // TODO 浮点数的支持
        TOKEN(TokenType::Number, 0);
        do {
            NEXT();
        } while (IsNumber(CURRENT_CHAR) || CURRENT_CHAR == _HM_C('.'));
        TOKEN_LENGTH((HMUINT32)(CURRENT_POS - TOKEN_START));
        mCurrentToken.value.type = ValueType::Integer;
        mCurrentToken.value.intval = (int) hm_strtoi(mCurrentToken.start);
    }